

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Configuration.cpp
# Opt level: O0

void __thiscall Corrade::Utility::Configuration::~Configuration(Configuration *this)

{
  bool bVar1;
  EnumSet<Corrade::Utility::Configuration::InternalFlag,_4294967295U> local_18;
  UnderlyingType local_14;
  Configuration *local_10;
  Configuration *this_local;
  
  local_10 = this;
  Containers::EnumSet<Corrade::Utility::Configuration::InternalFlag,_4294967295U>::EnumSet
            (&local_18,Changed);
  local_14 = (UnderlyingType)
             Containers::EnumSet<Corrade::Utility::Configuration::InternalFlag,_4294967295U>::
             operator&(&this->_flags,local_18);
  bVar1 = Containers::EnumSet::operator_cast_to_bool((EnumSet *)&local_14);
  if (bVar1) {
    save(this);
  }
  std::__cxx11::string::~string((string *)&this->_filename);
  ConfigurationGroup::~ConfigurationGroup(&this->super_ConfigurationGroup);
  return;
}

Assistant:

Configuration::~Configuration() { if(_flags & InternalFlag::Changed) save(); }